

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  string *psVar1;
  string *psVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pcVar5;
  Arena *rhs_arena;
  Arena *lhs_arena;
  Arena *local_58;
  Arena *local_50;
  uint local_44;
  uint32_t local_40 [4];
  
  local_50 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)local_50 & 1) != 0) {
    local_50 = *(Arena **)((ulong)local_50 & 0xfffffffffffffffe);
  }
  local_58 = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)local_58 & 1) != 0) {
    local_58 = *(Arena **)((ulong)local_58 & 0xfffffffffffffffe);
  }
  psVar1 = (string *)Reflection::MutableRawImpl(r,lhs,field);
  Reflection::MutableRawImpl(r,rhs,field);
  local_40[0] = ReflectionSchema::InlinedStringIndex(&r->schema_,field);
  local_44 = 0;
  psVar2 = absl::lts_20240722::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                     (local_40,&local_44,"index > 0u");
  if (psVar2 == (string *)0x0) {
    Reflection::MutableInlinedStringDonatedArray(r,lhs);
    Reflection::MutableInlinedStringDonatedArray(r,rhs);
    psVar2 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                       (&local_50,&local_58,"lhs_arena == rhs_arena");
    if (psVar2 == (string *)0x0) {
      std::__cxx11::string::swap(psVar1);
      return;
    }
    pcVar5 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uVar4 = 0x2a3;
  }
  else {
    pcVar5 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uVar4 = 0x29a;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
             ,uVar4,sVar3,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_40);
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}